

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopInsert(WhereLoopBuilder *pBuilder,WhereLoop *pTemplate)

{
  long lVar1;
  Index *pIVar2;
  WhereLoop **ppWVar3;
  WhereLoop *in_RSI;
  long *in_RDI;
  Index *pIndex;
  WhereLoop *pToDel;
  WhereLoop **ppTail;
  int rc;
  sqlite3 *db;
  WhereInfo *pWInfo;
  WhereLoop *p;
  WhereLoop **ppPrev;
  WhereLoop *in_stack_ffffffffffffffa8;
  sqlite3 *in_stack_ffffffffffffffb0;
  sqlite3 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  WhereLoop *local_28;
  int local_4;
  
  lVar1 = *in_RDI;
  if (*(int *)((long)in_RDI + 0x24) == 0) {
    if (in_RDI[3] != 0) {
      *(undefined2 *)in_RDI[3] = 0;
    }
    local_4 = 0x65;
  }
  else {
    *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + -1;
    whereLoopAdjustCost((WhereLoop *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc0),
                        (WhereLoop *)in_stack_ffffffffffffffb8);
    if (in_RDI[3] == 0) {
      ppWVar3 = whereLoopFindLesser((WhereLoop **)(lVar1 + 0x50),in_RSI);
      if (ppWVar3 == (WhereLoop **)0x0) {
        local_4 = 0;
      }
      else {
        local_28 = *ppWVar3;
        if (local_28 == (WhereLoop *)0x0) {
          local_28 = (WhereLoop *)
                     sqlite3DbMallocRawNN(in_stack_ffffffffffffffb8,(u64)in_stack_ffffffffffffffb0);
          *ppWVar3 = local_28;
          if (local_28 == (WhereLoop *)0x0) {
            return 7;
          }
          whereLoopInit(local_28);
          local_28->pNextLoop = (WhereLoop *)0x0;
        }
        else {
          in_stack_ffffffffffffffb8 = (sqlite3 *)&local_28->pNextLoop;
          in_stack_ffffffffffffffb0 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
          while (((in_stack_ffffffffffffffb8->pVfs != (sqlite3_vfs *)0x0 &&
                  (in_stack_ffffffffffffffb8 =
                        (sqlite3 *)
                        whereLoopFindLesser((WhereLoop **)in_stack_ffffffffffffffb8,in_RSI),
                  in_stack_ffffffffffffffb8 != (sqlite3 *)0x0)) &&
                 (in_stack_ffffffffffffffb0 = (sqlite3 *)in_stack_ffffffffffffffb8->pVfs,
                 in_stack_ffffffffffffffb0 != (sqlite3 *)0x0))) {
            in_stack_ffffffffffffffb8->pVfs =
                 *(sqlite3_vfs **)&in_stack_ffffffffffffffb0->nSchemaLock;
            whereLoopDelete(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          }
        }
        local_4 = whereLoopXfer(in_stack_ffffffffffffffb8,(WhereLoop *)in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8);
        if ((((local_28->wsFlags & 0x400) == 0) &&
            (pIVar2 = (local_28->u).btree.pIndex, pIVar2 != (Index *)0x0)) &&
           ((*(ushort *)&pIVar2->field_0x63 & 3) == 3)) {
          (local_28->u).btree.pIndex = (Index *)0x0;
        }
      }
    }
    else {
      if (in_RSI->nLTerm != 0) {
        whereOrInsert((WhereOrSet *)in_RDI[3],in_RSI->prereq,in_RSI->rRun,in_RSI->nOut);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int whereLoopInsert(WhereLoopBuilder *pBuilder, WhereLoop *pTemplate){
  WhereLoop **ppPrev, *p;
  WhereInfo *pWInfo = pBuilder->pWInfo;
  sqlite3 *db = pWInfo->pParse->db;
  int rc;

  /* Stop the search once we hit the query planner search limit */
  if( pBuilder->iPlanLimit==0 ){
    WHERETRACE(0xffffffff,("=== query planner search limit reached ===\n"));
    if( pBuilder->pOrSet ) pBuilder->pOrSet->n = 0;
    return SQLITE_DONE;
  }
  pBuilder->iPlanLimit--;

  whereLoopAdjustCost(pWInfo->pLoops, pTemplate);

  /* If pBuilder->pOrSet is defined, then only keep track of the costs
  ** and prereqs.
  */
  if( pBuilder->pOrSet!=0 ){
    if( pTemplate->nLTerm ){
#if WHERETRACE_ENABLED
      u16 n = pBuilder->pOrSet->n;
      int x =
#endif
      whereOrInsert(pBuilder->pOrSet, pTemplate->prereq, pTemplate->rRun,
                                    pTemplate->nOut);
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(x?"   or-%d:  ":"   or-X:  ", n);
        sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
      }
#endif
    }
    return SQLITE_OK;
  }

  /* Look for an existing WhereLoop to replace with pTemplate
  */
  ppPrev = whereLoopFindLesser(&pWInfo->pLoops, pTemplate);

  if( ppPrev==0 ){
    /* There already exists a WhereLoop on the list that is better
    ** than pTemplate, so just ignore pTemplate */
#if WHERETRACE_ENABLED /* 0x8 */
    if( sqlite3WhereTrace & 0x8 ){
      sqlite3DebugPrintf("   skip: ");
      sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
    }
#endif
    return SQLITE_OK;
  }else{
    p = *ppPrev;
  }

  /* If we reach this point it means that either p[] should be overwritten
  ** with pTemplate[] if p[] exists, or if p==NULL then allocate a new
  ** WhereLoop and insert it.
  */
#if WHERETRACE_ENABLED /* 0x8 */
  if( sqlite3WhereTrace & 0x8 ){
    if( p!=0 ){
      sqlite3DebugPrintf("replace: ");
      sqlite3WhereLoopPrint(p, pBuilder->pWC);
      sqlite3DebugPrintf("   with: ");
    }else{
      sqlite3DebugPrintf("    add: ");
    }
    sqlite3WhereLoopPrint(pTemplate, pBuilder->pWC);
  }
#endif
  if( p==0 ){
    /* Allocate a new WhereLoop to add to the end of the list */
    *ppPrev = p = sqlite3DbMallocRawNN(db, sizeof(WhereLoop));
    if( p==0 ) return SQLITE_NOMEM_BKPT;
    whereLoopInit(p);
    p->pNextLoop = 0;
  }else{
    /* We will be overwriting WhereLoop p[].  But before we do, first
    ** go through the rest of the list and delete any other entries besides
    ** p[] that are also supplanted by pTemplate */
    WhereLoop **ppTail = &p->pNextLoop;
    WhereLoop *pToDel;
    while( *ppTail ){
      ppTail = whereLoopFindLesser(ppTail, pTemplate);
      if( ppTail==0 ) break;
      pToDel = *ppTail;
      if( pToDel==0 ) break;
      *ppTail = pToDel->pNextLoop;
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(" delete: ");
        sqlite3WhereLoopPrint(pToDel, pBuilder->pWC);
      }
#endif
      whereLoopDelete(db, pToDel);
    }
  }
  rc = whereLoopXfer(db, p, pTemplate);
  if( (p->wsFlags & WHERE_VIRTUALTABLE)==0 ){
    Index *pIndex = p->u.btree.pIndex;
    if( pIndex && pIndex->idxType==SQLITE_IDXTYPE_IPK ){
      p->u.btree.pIndex = 0;
    }
  }
  return rc;
}